

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

int stbi__jpeg_get_bits(stbi__jpeg *j,int n)

{
  uint uVar1;
  uint uVar2;
  int in_ESI;
  long in_RDI;
  uint k;
  undefined4 in_stack_fffffffffffffff0;
  
  if (*(int *)(in_RDI + 0x4824) < in_ESI) {
    stbi__grow_buffer_unsafe((stbi__jpeg *)CONCAT44(in_ESI,in_stack_fffffffffffffff0));
  }
  uVar2 = *(int *)(in_RDI + 0x4820) << ((byte)in_ESI & 0x1f) |
          *(uint *)(in_RDI + 0x4820) >> (0x20 - (byte)in_ESI & 0x1f);
  *(uint *)(in_RDI + 0x4820) = uVar2 & (stbi__bmask[in_ESI] ^ 0xffffffff);
  uVar1 = stbi__bmask[in_ESI];
  *(int *)(in_RDI + 0x4824) = *(int *)(in_RDI + 0x4824) - in_ESI;
  return uVar1 & uVar2;
}

Assistant:

stbi_inline static int stbi__jpeg_get_bits(stbi__jpeg *j, int n)
{
   unsigned int k;
   if (j->code_bits < n) stbi__grow_buffer_unsafe(j);
   k = stbi_lrot(j->code_buffer, n);
   j->code_buffer = k & ~stbi__bmask[n];
   k &= stbi__bmask[n];
   j->code_bits -= n;
   return k;
}